

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatLut.c
# Opt level: O2

int Sbl_ManWindow2(Sbl_Man_t *p,int iPivot)

{
  Vec_Int_t *pVVar1;
  int iVar2;
  abctime aVar3;
  abctime aVar4;
  Vec_Int_t *vAnds;
  Vec_Int_t *vLeaves;
  Vec_Int_t *vNodes;
  Vec_Int_t *vRoots;
  Vec_Int_t *local_38;
  Vec_Int_t *local_30;
  Vec_Int_t *local_28;
  Vec_Int_t *local_20;
  
  aVar3 = Abc_Clock();
  iVar2 = Gia_ManComputeOneWin(p->pGia,iPivot,&local_20,&local_28,&local_30,&local_38);
  aVar4 = Abc_Clock();
  p->timeWin = p->timeWin + (aVar4 - aVar3);
  if (iVar2 != 0) {
    pVVar1 = p->vRoots;
    pVVar1->nSize = 0;
    Vec_IntAppend(pVVar1,local_20);
    pVVar1 = p->vNodes;
    pVVar1->nSize = 0;
    Vec_IntAppend(pVVar1,local_28);
    pVVar1 = p->vLeaves;
    pVVar1->nSize = 0;
    Vec_IntAppend(pVVar1,local_30);
    pVVar1 = p->vAnds;
    pVVar1->nSize = 0;
    Vec_IntAppend(pVVar1,local_38);
  }
  return iVar2;
}

Assistant:

int Sbl_ManWindow2( Sbl_Man_t * p, int iPivot )
{
    abctime clk = Abc_Clock();
    Vec_Int_t * vRoots, * vNodes, * vLeaves, * vAnds;
    int Count = Gia_ManComputeOneWin( p->pGia, iPivot, &vRoots, &vNodes, &vLeaves, &vAnds );
    p->timeWin += Abc_Clock() - clk;
    if ( Count == 0 )
        return 0;
    Vec_IntClear( p->vRoots );   Vec_IntAppend( p->vRoots,  vRoots );
    Vec_IntClear( p->vNodes );   Vec_IntAppend( p->vNodes,  vNodes );
    Vec_IntClear( p->vLeaves );  Vec_IntAppend( p->vLeaves, vLeaves );
    Vec_IntClear( p->vAnds );    Vec_IntAppend( p->vAnds,   vAnds );
//Vec_IntPrint( vRoots );
//Vec_IntPrint( vAnds );
//Vec_IntPrint( vLeaves );
    // recompute internal nodes
//    Gia_ManIncrementTravId( p->pGia );
//    Gia_ManCollectAnds( p->pGia, Vec_IntArray(p->vRoots), Vec_IntSize(p->vRoots), p->vAnds, p->vLeaves );
    return Count;
}